

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall
TestCharReaderTestparseWithNoErrorsTestingOffsets::runTestCase
          (TestCharReaderTestparseWithNoErrorsTestingOffsets *this)

{
  int iVar1;
  CharReader *pCVar2;
  long lVar3;
  char *pcVar4;
  char *pcVar5;
  byte bVar6;
  string errs;
  Value root;
  CharReaderBuilder b;
  char doc [111];
  
  bVar6 = 0;
  Json::CharReaderBuilder::CharReaderBuilder(&b);
  pCVar2 = Json::CharReaderBuilder::newCharReader(&b);
  errs._M_dataplus._M_p = (pointer)&errs.field_2;
  errs._M_string_length = 0;
  errs.field_2._M_local_buf[0] = '\0';
  Json::Value::Value(&root,nullValue);
  pcVar4 = 
  "{ \"property\" : [\"value\", \"value2\"], \"obj\" : { \"nested\" : 123, \"bool\" : true}, \"null\" : null, \"false\" : false }"
  ;
  pcVar5 = doc;
  for (lVar3 = 0x6f; lVar3 != 0; lVar3 = lVar3 + -1) {
    *pcVar5 = *pcVar4;
    pcVar4 = pcVar4 + (ulong)bVar6 * -2 + 1;
    pcVar5 = pcVar5 + (ulong)bVar6 * -2 + 1;
  }
  iVar1 = (*pCVar2->_vptr_CharReader[2])(pCVar2,doc,doc + 0x6e,&root,&errs);
  if ((char)iVar1 == '\0') {
    JsonTest::TestResult::addFailure
              ((this->super_CharReaderTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
               ,0x73e,"ok");
  }
  if (errs._M_string_length != 0) {
    JsonTest::TestResult::addFailure
              ((this->super_CharReaderTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
               ,0x73f,"errs.size() == 0");
  }
  (*pCVar2->_vptr_CharReader[1])(pCVar2);
  Json::Value::~Value(&root);
  std::__cxx11::string::~string((string *)&errs);
  Json::CharReaderBuilder::~CharReaderBuilder(&b);
  return;
}

Assistant:

JSONTEST_FIXTURE(CharReaderTest, parseWithNoErrorsTestingOffsets) {
  Json::CharReaderBuilder b;
  Json::CharReader* reader(b.newCharReader());
  std::string errs;
  Json::Value root;
  char const doc[] =
                         "{ \"property\" : [\"value\", \"value2\"], \"obj\" : "
                         "{ \"nested\" : 123, \"bool\" : true}, \"null\" : "
                         "null, \"false\" : false }";
  bool ok = reader->parse(
      doc, doc + std::strlen(doc),
      &root, &errs);
  JSONTEST_ASSERT(ok);
  JSONTEST_ASSERT(errs.size() == 0);
  delete reader;
}